

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

void __thiscall QAbstractItemView::selectAll(QAbstractItemView *this)

{
  int iVar1;
  long *plVar2;
  long *plVar3;
  char cVar4;
  undefined4 uVar5;
  uint uVar6;
  long in_FS_OFFSET;
  QModelIndex local_60;
  QModelIndex local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  plVar2 = *(long **)(this + 8);
  iVar1 = (int)plVar2[0x67];
  if (iVar1 - 2U < 2) {
    uVar6 = 0x23;
    if (*(int *)((long)plVar2 + 0x33c) != 1) {
      uVar6 = (uint)(*(int *)((long)plVar2 + 0x33c) == 2) << 6 | 3;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      (**(code **)(*plVar2 + 0x118))(plVar2,uVar6);
      return;
    }
  }
  else {
    if ((iVar1 == 0) || (iVar1 == 4)) {
      plVar3 = (long *)plVar2[0x5f];
      QPersistentModelIndex::operator_cast_to_QModelIndex
                (&local_48,(QPersistentModelIndex *)(plVar2 + 0x77));
      cVar4 = (**(code **)(*plVar3 + 0x88))(plVar3,&local_48);
      if (cVar4 != '\0') {
        plVar3 = (long *)plVar2[0x5f];
        QPersistentModelIndex::operator_cast_to_QModelIndex
                  (&local_60,(QPersistentModelIndex *)(plVar2 + 0x77));
        (**(code **)(*plVar3 + 0x60))(&local_48,plVar3,0,0,&local_60);
        uVar5 = (**(code **)(*(long *)this + 0x2e8))(this,&local_48,0);
        (**(code **)(*plVar2 + 0x118))(plVar2,uVar5);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::selectAll()
{
    Q_D(QAbstractItemView);
    const SelectionMode mode = d->selectionMode;
    switch (mode) {
    case MultiSelection:
    case ExtendedSelection:
        d->selectAll(QItemSelectionModel::ClearAndSelect
                     | d->selectionBehaviorFlags());
        break;
    case NoSelection:
    case ContiguousSelection:
        if (d->model->hasChildren(d->root))
            d->selectAll(selectionCommand(d->model->index(0, 0, d->root)));
        break;
    case SingleSelection:
        break;
    }
}